

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int histo_minmax_expr_workfn
              (long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
              void *userPtr)

{
  double dVar1;
  double dVar2;
  void *userPtr_00;
  double *pdVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  userPtr_00 = *userPtr;
  iVar5 = fits_parser_workfn(totalrows,offset,firstrow,nrows,nCols,colData,userPtr_00);
  pdVar3 = (double *)colData[(long)nCols + -1].array;
  lVar4 = *(long *)((long)userPtr_00 + 0x50);
  dVar1 = **(double **)(*userPtr + 0x10);
  lVar6 = 1;
  do {
    if (nrows * lVar4 < lVar6) {
      return iVar5;
    }
    dVar7 = pdVar3[lVar6];
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      if ((dVar7 != dVar1) || (NAN(dVar7) || NAN(dVar1))) goto LAB_001794c8;
    }
    else {
LAB_001794c8:
      dVar2 = *(double *)((long)userPtr + 8);
      if ((dVar7 < dVar2) || ((dVar2 == -9.1191291391491e-36 && (!NAN(dVar2))))) {
        *(double *)((long)userPtr + 8) = dVar7;
        dVar7 = pdVar3[lVar6];
      }
      dVar2 = *(double *)((long)userPtr + 0x10);
      if ((dVar2 < dVar7) || ((dVar2 == -9.1191291391491e-36 && (!NAN(dVar2))))) {
        *(double *)((long)userPtr + 0x10) = dVar7;
      }
      *(long *)((long)userPtr + 0x20) = *(long *)((long)userPtr + 0x20) + 1;
    }
    *(long *)((long)userPtr + 0x18) = *(long *)((long)userPtr + 0x18) + 1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static int histo_minmax_expr_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which evaluates a parser result and computes       */
/* min max value */
/*---------------------------------------------------------------------------*/
{
  int status = 0;
  long i;
  double *data;
  double nulval;
  struct histo_minmax_workfn_struct *wf = ((struct histo_minmax_workfn_struct *)userPtr);
  struct ParseStatusVariables *pv = &(wf->Info->parseVariables);
  iteratorCol *outcol = &(colData[nCols-1]);

  /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
  status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
			      nCols, colData, (void *) wf->Info);

  /* The result of the calculation is in pv->Data, and null value in pv->Null */
  data = (double *)(outcol->array);
  nulval = *((double *)(wf->Info->nullPtr));

  for (i = 1; i<=(nrows*pv->repeat); i++ ) {
    /* Note that data[0] == 0 indicates no null values at all!!! */
    if (data[0] == 0 || data[i] != nulval) {
      if (data[i] < wf->datamin || wf->datamin == DOUBLENULLVALUE) wf->datamin = data[i];
      if (data[i] > wf->datamax || wf->datamax == DOUBLENULLVALUE) wf->datamax = data[i];
      wf->ngood ++;
    }
     wf->ntotal ++;
  }

  return status;
}